

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_gen.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::TailCallTableInfo::TailCallTableInfo
          (TailCallTableInfo *this,Descriptor *descriptor,MessageOptions *message_options,
          Span<const_google::protobuf::internal::TailCallTableInfo::FieldOptions> ordered_fields)

{
  Span<const_google::protobuf::internal::TailCallTableInfo::FieldOptions> fields;
  Span<const_google::protobuf::internal::TailCallTableInfo::FieldOptions> fields_00;
  Span<const_google::protobuf::internal::TailCallTableInfo::FieldOptions> fields_01;
  initializer_list<google::protobuf::internal::TailCallTableInfo::FastFieldInfo> __l;
  initializer_list<google::protobuf::internal::TailCallTableInfo::AuxEntry> __l_00;
  initializer_list<google::protobuf::internal::TailCallTableInfo::FastFieldInfo> __l_01;
  Descriptor *message_options_00;
  MessageOptions *pMVar1;
  bool bVar2;
  uint32_t uVar3;
  type tVar4;
  MessageOptions *pMVar5;
  iterator pFVar6;
  iterator pFVar7;
  reference pvVar8;
  _Optional_payload_base<unsigned_int> end_group_tag_00;
  size_type sVar9;
  char *pcVar10;
  LogMessage *pLVar11;
  TailCallTableInfo *pTVar12;
  Span<const_google::protobuf::internal::TailCallTableInfo::FieldOptions> ordered_fields_00;
  Span<const_google::protobuf::internal::TailCallTableInfo::FieldOptions> ordered_fields_01;
  Span<const_google::protobuf::internal::TailCallTableInfo::FieldOptions> ordered_fields_02;
  vector<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
  *in_stack_fffffffffffff7b8;
  FastFieldInfo *local_7d8;
  TcParseFunction local_735;
  TcParseFunction local_734;
  TcParseFunction local_732;
  Span<const_google::protobuf::internal::TailCallTableInfo::FieldEntryInfo> local_6e0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_6d0;
  LogMessage local_6b8;
  Voidify local_6a1;
  unsigned_long local_6a0;
  unsigned_long local_698;
  Nullable<const_char_*> local_690;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  pointer pFStack_680;
  NumToEntryTable local_678;
  long local_658;
  size_t merge_i;
  size_t i;
  TailCallTableInfo *local_638;
  pointer pFStack_630;
  _Optional_payload_base<unsigned_int> local_628;
  _Optional_payload_base<unsigned_int> local_620;
  ulong local_618;
  size_t num_fast_fields;
  undefined1 local_608 [4];
  uint32_t important_fields;
  FastFieldInfo fast_fields [32];
  optional<unsigned_int> end_group_tag;
  vector<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo>_>
  local_1e8;
  undefined4 local_1d0;
  undefined4 uStack_1cc;
  FieldDescriptor *local_1c8;
  undefined4 local_1c0;
  undefined4 uStack_1bc;
  FieldDescriptor *local_1b8;
  undefined4 local_1a8;
  undefined4 uStack_1a4;
  FieldDescriptor *local_1a0;
  byte local_191;
  LogMessage local_190;
  Voidify local_17a [2];
  TailCallTableInfo *local_178;
  pointer pFStack_170;
  Span<const_google::protobuf::internal::TailCallTableInfo::FieldEntryInfo> local_160;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_150;
  TailCallTableInfo *local_138;
  pointer pFStack_130;
  NumToEntryTable local_128;
  _Variadic_union<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
  local_108;
  undefined8 uStack_f0;
  _Variadic_union<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
  *local_e0;
  undefined8 local_d8;
  byte local_c9;
  LogMessage local_c8;
  Voidify local_b1;
  AuxEntry local_b0;
  iterator local_a0;
  undefined8 local_98;
  NonField local_8e;
  variant<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
  local_88 [32];
  variant<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
  *local_68;
  undefined8 local_60;
  byte local_51;
  LogMessage local_50;
  Voidify local_3d [13];
  Descriptor *local_30;
  MessageOptions *message_options_local;
  Descriptor *descriptor_local;
  TailCallTableInfo *this_local;
  Span<const_google::protobuf::internal::TailCallTableInfo::FieldOptions> ordered_fields_local;
  
  ordered_fields_local.ptr_ = (pointer)ordered_fields.len_;
  pTVar12 = (TailCallTableInfo *)ordered_fields.ptr_;
  local_30 = (Descriptor *)message_options;
  message_options_local = (MessageOptions *)descriptor;
  descriptor_local = (Descriptor *)this;
  this_local = pTVar12;
  std::
  vector<google::protobuf::internal::TailCallTableInfo::FastFieldInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FastFieldInfo>_>
  ::vector(&this->fast_path_fields);
  std::
  vector<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo>_>
  ::vector(&this->field_entries);
  std::
  vector<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
  ::vector(&this->aux_entries);
  NumToEntryTable::NumToEntryTable(&this->num_to_entry_table);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&this->field_name_data);
  pMVar5 = Descriptor::options((Descriptor *)message_options_local);
  bVar2 = MessageOptions::map_entry(pMVar5);
  if (bVar2) {
    local_732 = kDiscardEverythingFallback;
  }
  else {
    if (((local_30->field_0x1 & 1) == 0) ||
       (bVar2 = anon_unknown_36::HasWeakFields((Descriptor *)message_options_local), bVar2)) {
      local_734 = kReflectionFallback;
    }
    else {
      bVar2 = (bool)(local_30->super_SymbolBase).symbol_type_;
      pTVar12 = (TailCallTableInfo *)CONCAT71((int7)((ulong)pTVar12 >> 8),bVar2);
      local_735 = kGenericFallbackLite;
      if ((bVar2 & 1U) == 0) {
        local_735 = kGenericFallback;
      }
      local_734 = local_735;
    }
    local_732 = local_734;
  }
  pcVar10 = (char *)CONCAT71((int7)((ulong)pTVar12 >> 8),local_732);
  this->fallback_function = local_732;
  pMVar5 = Descriptor::options((Descriptor *)message_options_local);
  bVar2 = MessageOptions::message_set_wire_format(pMVar5);
  if (bVar2) {
    bVar2 = absl::lts_20250127::
            Span<const_google::protobuf::internal::TailCallTableInfo::FieldOptions>::empty
                      ((Span<const_google::protobuf::internal::TailCallTableInfo::FieldOptions> *)
                       &this_local);
    local_51 = 0;
    if (((bVar2 ^ 0xffU) & 1) != 0) {
      pcVar10 = "ordered_fields.empty()";
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_50,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_gen.cc"
                 ,0x3a2,"ordered_fields.empty()");
      local_51 = 1;
      pLVar11 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_50);
      absl::lts_20250127::log_internal::Voidify::operator&&(local_3d,pLVar11);
    }
    if ((local_51 & 1) != 0) {
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_50);
    }
    if ((local_30->field_0x1 & 1) == 0) {
      local_c9 = 0;
      if (((local_30->super_SymbolBase).symbol_type_ & 1) != 0) {
        pcVar10 = "!message_options.is_lite";
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_c8,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_gen.cc"
                   ,0x3ac,"!message_options.is_lite");
        local_c9 = 1;
        pLVar11 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_c8);
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_b1,pLVar11);
      }
      if ((local_c9 & 1) != 0) {
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_c8);
      }
      local_108._16_8_ = 0;
      uStack_f0 = 2;
      local_108._0_8_ = 0x77;
      local_108._8_8_ = 0;
      local_e0 = &local_108;
      local_d8 = 1;
      __l._M_len = 1;
      __l._M_array = (iterator)local_e0;
      std::
      vector<google::protobuf::internal::TailCallTableInfo::FastFieldInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FastFieldInfo>_>
      ::operator=(&this->fast_path_fields,__l);
    }
    else {
      pcVar10 = (char *)(CONCAT71((int7)((ulong)pcVar10 >> 8),
                                  (local_30->super_SymbolBase).symbol_type_) & 0xffffffffffffff01);
      local_8e.func = kMessageSetWireFormatParseLoop - (char)pcVar10;
      local_8e.coded_tag = 0;
      local_8e.nonfield_info = 0;
      std::
      variant<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
      ::
      variant<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField,void,void,google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField,void>
                (local_88,&local_8e);
      local_60 = 1;
      __l_01._M_len = 1;
      __l_01._M_array = (iterator)local_88;
      local_68 = local_88;
      std::
      vector<google::protobuf::internal::TailCallTableInfo::FastFieldInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FastFieldInfo>_>
      ::operator=(&this->fast_path_fields,__l_01);
      local_b0.type = kSelfVerifyFunc;
      local_b0.field_1.field = (FieldDescriptor *)0x0;
      local_a0 = &local_b0;
      local_98 = 1;
      __l_00._M_len = 1;
      __l_00._M_array = local_a0;
      std::
      vector<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
      ::operator=(&this->aux_entries,__l_00);
    }
    this->table_size_log2 = 0;
    local_138 = this_local;
    pFStack_130 = ordered_fields_local.ptr_;
    ordered_fields_00.len_ = (size_type)pcVar10;
    ordered_fields_00.ptr_ = ordered_fields_local.ptr_;
    anon_unknown_36::MakeNumToEntryTable(&local_128,(anon_unknown_36 *)this_local,ordered_fields_00)
    ;
    NumToEntryTable::operator=(&this->num_to_entry_table,&local_128);
    NumToEntryTable::~NumToEntryTable(&local_128);
    pMVar1 = message_options_local;
    absl::lts_20250127::Span<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo_const>::
    Span<std::vector<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo,std::allocator<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo>>,void,std::vector<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo,std::allocator<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo>>,int>
              ((Span<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo_const> *)
               &local_160,&this->field_entries);
    local_178 = this_local;
    pFStack_170 = ordered_fields_local.ptr_;
    fields.len_ = (size_type)ordered_fields_local.ptr_;
    fields.ptr_ = (pointer)this_local;
    anon_unknown_36::GenerateFieldNames
              (&local_150,(Descriptor *)pMVar1,local_160,(MessageOptions *)local_30,fields);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (&this->field_name_data,&local_150);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_150);
  }
  else {
    pFVar6 = absl::lts_20250127::
             Span<const_google::protobuf::internal::TailCallTableInfo::FieldOptions>::begin
                       ((Span<const_google::protobuf::internal::TailCallTableInfo::FieldOptions> *)
                        &this_local);
    pFVar7 = absl::lts_20250127::
             Span<const_google::protobuf::internal::TailCallTableInfo::FieldOptions>::end
                       ((Span<const_google::protobuf::internal::TailCallTableInfo::FieldOptions> *)
                        &this_local);
    local_191 = 0;
    bVar2 = std::
            is_sorted<google::protobuf::internal::TailCallTableInfo::FieldOptions_const*,google::protobuf::internal::TailCallTableInfo::FieldOptions(google::protobuf::Descriptor_const*,google::protobuf::internal::TailCallTableInfo::MessageOptions_const&,absl::lts_20250127::Span<google::protobuf::internal::TailCallTableInfo::FieldOptions_const>)::__0>
                      (pFVar6,pFVar7);
    if (((bVar2 ^ 0xffU) & 1) != 0) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_190,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_gen.cc"
                 ,0x3bf,
                 "std::is_sorted(ordered_fields.begin(), ordered_fields.end(), [](const auto& lhs, const auto& rhs) { return lhs.field->number() < rhs.field->number(); })"
                );
      local_191 = 1;
      pLVar11 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_190);
      absl::lts_20250127::log_internal::Voidify::operator&&(local_17a,pLVar11);
    }
    if ((local_191 & 1) != 0) {
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_190);
    }
    pFVar6 = absl::lts_20250127::
             Span<const_google::protobuf::internal::TailCallTableInfo::FieldOptions>::begin
                       ((Span<const_google::protobuf::internal::TailCallTableInfo::FieldOptions> *)
                        &this_local);
    pFVar7 = absl::lts_20250127::
             Span<const_google::protobuf::internal::TailCallTableInfo::FieldOptions>::end
                       ((Span<const_google::protobuf::internal::TailCallTableInfo::FieldOptions> *)
                        &this_local);
    bVar2 = std::
            any_of<google::protobuf::internal::TailCallTableInfo::FieldOptions_const*,google::protobuf::internal::TailCallTableInfo::FieldOptions(google::protobuf::Descriptor_const*,google::protobuf::internal::TailCallTableInfo::MessageOptions_const&,absl::lts_20250127::Span<google::protobuf::internal::TailCallTableInfo::FieldOptions_const>)::__1>
                      (pFVar6,pFVar7);
    if (bVar2) {
      std::
      vector<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
      ::resize(&this->aux_entries,1);
      local_1a8 = 1;
      local_1a0 = (FieldDescriptor *)0x0;
      pvVar8 = std::
               vector<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
               ::operator[](&this->aux_entries,0);
      *(ulong *)pvVar8 = CONCAT44(uStack_1a4,local_1a8);
      (pvVar8->field_1).field = local_1a0;
    }
    pFVar6 = absl::lts_20250127::
             Span<const_google::protobuf::internal::TailCallTableInfo::FieldOptions>::begin
                       ((Span<const_google::protobuf::internal::TailCallTableInfo::FieldOptions> *)
                        &this_local);
    pFVar7 = absl::lts_20250127::
             Span<const_google::protobuf::internal::TailCallTableInfo::FieldOptions>::end
                       ((Span<const_google::protobuf::internal::TailCallTableInfo::FieldOptions> *)
                        &this_local);
    bVar2 = std::
            any_of<google::protobuf::internal::TailCallTableInfo::FieldOptions_const*,google::protobuf::internal::TailCallTableInfo::FieldOptions(google::protobuf::Descriptor_const*,google::protobuf::internal::TailCallTableInfo::MessageOptions_const&,absl::lts_20250127::Span<google::protobuf::internal::TailCallTableInfo::FieldOptions_const>)::__2>
                      (pFVar6,pFVar7);
    if (bVar2) {
      std::
      vector<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
      ::resize(&this->aux_entries,3);
      local_1c0 = 2;
      local_1b8 = (FieldDescriptor *)0x0;
      pvVar8 = std::
               vector<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
               ::operator[](&this->aux_entries,1);
      *(ulong *)pvVar8 = CONCAT44(uStack_1bc,local_1c0);
      (pvVar8->field_1).field = local_1b8;
      local_1d0 = 3;
      local_1c8 = (FieldDescriptor *)0x0;
      pvVar8 = std::
               vector<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
               ::operator[](&this->aux_entries,2);
      *(ulong *)pvVar8 = CONCAT44(uStack_1cc,local_1d0);
      (pvVar8->field_1).field = local_1c8;
    }
    ordered_fields_02.len_ = &this->aux_entries;
    ordered_fields_02.ptr_ = ordered_fields_local.ptr_;
    BuildFieldEntries(&local_1e8,(TailCallTableInfo *)message_options_local,local_30,
                      (MessageOptions *)this_local,ordered_fields_02,in_stack_fffffffffffff7b8);
    std::
    vector<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo>_>
    ::operator=(&this->field_entries,&local_1e8);
    std::
    vector<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo>_>
    ::~vector(&local_1e8);
    end_group_tag_00 =
         (_Optional_payload_base<unsigned_int>)GetEndGroupTag((Descriptor *)message_options_local);
    local_7d8 = (FastFieldInfo *)local_608;
    do {
      FastFieldInfo::FastFieldInfo(local_7d8);
      local_7d8 = local_7d8 + 1;
    } while (local_7d8 !=
             (FastFieldInfo *)
             ((long)&fast_fields[0x1f].data.
                     super__Variant_base<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                     .
                     super__Move_assign_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                     .
                     super__Copy_assign_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                     .
                     super__Move_ctor_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                     .
                     super__Copy_ctor_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
             + 0x18U));
    num_fast_fields._4_4_ = 0;
    sVar9 = absl::lts_20250127::
            Span<const_google::protobuf::internal::TailCallTableInfo::FieldOptions>::size
                      ((Span<const_google::protobuf::internal::TailCallTableInfo::FieldOptions> *)
                       &this_local);
    local_620 = end_group_tag_00;
    uVar3 = FastParseTableSize(sVar9,(optional<unsigned_int>)end_group_tag_00);
    message_options_00 = local_30;
    local_618 = (ulong)uVar3;
    local_638 = this_local;
    pFStack_630 = ordered_fields_local.ptr_;
    local_628 = end_group_tag_00;
    _i = absl::lts_20250127::MakeSpan<google::protobuf::internal::TailCallTableInfo::FastFieldInfo>
                   ((Nullable<google::protobuf::internal::TailCallTableInfo::FastFieldInfo_*>)
                    local_608,local_618);
    fields_01.len_ = (size_type)pFStack_630;
    fields_01.ptr_ = (pointer)local_638;
    anon_unknown_36::PopulateFastFields
              ((optional<unsigned_int>)local_628,&this->field_entries,
               (MessageOptions *)message_options_00,fields_01,_i,
               (uint32_t *)((long)&num_fast_fields + 4));
    while( true ) {
      bVar2 = false;
      if (1 < local_618) {
        bVar2 = (num_fast_fields._4_4_ & num_fast_fields._4_4_ >> ((byte)(local_618 >> 1) & 0x1f))
                == 0;
      }
      if (!bVar2) break;
      local_618 = local_618 >> 1;
      for (merge_i = 0; merge_i < local_618; merge_i = merge_i + 1) {
        local_658 = merge_i + local_618;
        if (((num_fast_fields._4_4_ >> ((byte)local_658 & 0x1f) & 1) != 0) ||
           (bVar2 = FastFieldInfo::is_empty((FastFieldInfo *)(local_608 + merge_i * 0x20)), bVar2))
        {
          *(undefined8 *)(local_608 + merge_i * 0x20) =
               *(undefined8 *)(local_608 + local_658 * 0x20);
          *(undefined8 *)
           &fast_fields[merge_i].data.
            super__Variant_base<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
            .
            super__Move_assign_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
            .
            super__Copy_assign_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
            .
            super__Move_ctor_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
               = *(undefined8 *)
                  &fast_fields[local_658].data.
                   super__Variant_base<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                   .
                   super__Move_assign_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                   .
                   super__Copy_assign_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                   .
                   super__Move_ctor_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
          ;
          *(undefined8 *)
           ((long)&fast_fields[merge_i].data.
                   super__Variant_base<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                   .
                   super__Move_assign_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                   .
                   super__Copy_assign_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                   .
                   super__Move_ctor_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                   .
                   super__Copy_ctor_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
           + 8) = *(undefined8 *)
                   ((long)&fast_fields[local_658].data.
                           super__Variant_base<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                           .
                           super__Move_assign_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                           .
                           super__Copy_assign_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                           .
                           super__Move_ctor_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                           .
                           super__Copy_ctor_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                   + 8);
          *(undefined8 *)
           ((long)&fast_fields[merge_i].data.
                   super__Variant_base<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                   .
                   super__Move_assign_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                   .
                   super__Copy_assign_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                   .
                   super__Move_ctor_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                   .
                   super__Copy_ctor_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
           + 0x10) = *(undefined8 *)
                      ((long)&fast_fields[local_658].data.
                              super__Variant_base<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                              .
                              super__Move_assign_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                              .
                              super__Copy_assign_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                              .
                              super__Move_ctor_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                              .
                              super__Copy_ctor_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                      + 0x10);
        }
      }
      num_fast_fields._4_4_ =
           num_fast_fields._4_4_ >> ((byte)local_618 & 0x1f) | num_fast_fields._4_4_;
    }
    std::
    vector<google::protobuf::internal::TailCallTableInfo::FastFieldInfo,std::allocator<google::protobuf::internal::TailCallTableInfo::FastFieldInfo>>
    ::assign<google::protobuf::internal::TailCallTableInfo::FastFieldInfo*,void>
              ((vector<google::protobuf::internal::TailCallTableInfo::FastFieldInfo,std::allocator<google::protobuf::internal::TailCallTableInfo::FastFieldInfo>>
                *)&this->fast_path_fields,(FastFieldInfo *)local_608,
               (FastFieldInfo *)(local_608 + local_618 * 0x20));
    tVar4 = absl::lts_20250127::bit_width<unsigned_long>(local_618);
    ordered_fields_01.len_._0_4_ = tVar4 + -1;
    this->table_size_log2 = (int)ordered_fields_01.len_;
    absl_log_internal_check_op_result = (Nullable<const_char_*>)this_local;
    pFStack_680 = ordered_fields_local.ptr_;
    ordered_fields_01.ptr_ = ordered_fields_local.ptr_;
    ordered_fields_01.len_._4_4_ = 0;
    anon_unknown_36::MakeNumToEntryTable(&local_678,(anon_unknown_36 *)this_local,ordered_fields_01)
    ;
    NumToEntryTable::operator=(&this->num_to_entry_table,&local_678);
    NumToEntryTable::~NumToEntryTable(&local_678);
    sVar9 = std::
            vector<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo>_>
            ::size(&this->field_entries);
    local_698 = absl::lts_20250127::log_internal::GetReferenceableValue(sVar9);
    sVar9 = absl::lts_20250127::
            Span<const_google::protobuf::internal::TailCallTableInfo::FieldOptions>::size
                      ((Span<const_google::protobuf::internal::TailCallTableInfo::FieldOptions> *)
                       &this_local);
    local_6a0 = absl::lts_20250127::log_internal::GetReferenceableValue(sVar9);
    local_690 = absl::lts_20250127::log_internal::Check_EQImpl<unsigned_long,unsigned_long>
                          (&local_698,&local_6a0,"field_entries.size() == ordered_fields.size()");
    pMVar1 = message_options_local;
    if (local_690 != (Nullable<const_char_*>)0x0) {
      pcVar10 = absl::lts_20250127::implicit_cast<char_const*>(local_690);
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_6b8,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_gen.cc"
                 ,0x407,pcVar10);
      pLVar11 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_6b8);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_6a1,pLVar11);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_6b8);
    }
    absl::lts_20250127::Span<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo_const>::
    Span<std::vector<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo,std::allocator<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo>>,void,std::vector<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo,std::allocator<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo>>,int>
              ((Span<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo_const> *)
               &local_6e0,&this->field_entries);
    fields_00.len_ = (size_type)ordered_fields_local.ptr_;
    fields_00.ptr_ = (pointer)this_local;
    anon_unknown_36::GenerateFieldNames
              (&local_6d0,(Descriptor *)pMVar1,local_6e0,(MessageOptions *)local_30,fields_00);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (&this->field_name_data,&local_6d0);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_6d0);
  }
  return;
}

Assistant:

TailCallTableInfo::TailCallTableInfo(
    const Descriptor* descriptor, const MessageOptions& message_options,
    absl::Span<const FieldOptions> ordered_fields) {
  fallback_function =
      // Map entries discard unknown data
      descriptor->options().map_entry()
          ? TcParseFunction::kDiscardEverythingFallback
      // Reflection and weak messages have the reflection fallback
      : !message_options.uses_codegen || HasWeakFields(descriptor)
          ? TcParseFunction::kReflectionFallback
      // Codegen messages have lite and non-lite version
      : message_options.is_lite ? TcParseFunction::kGenericFallbackLite
                                : TcParseFunction::kGenericFallback;

  if (descriptor->options().message_set_wire_format()) {
    ABSL_DCHECK(ordered_fields.empty());
    if (message_options.uses_codegen) {
      fast_path_fields = {{TailCallTableInfo::FastFieldInfo::NonField{
          message_options.is_lite
              ? TcParseFunction::kMessageSetWireFormatParseLoopLite
              : TcParseFunction::kMessageSetWireFormatParseLoop,
          0, 0}}};

      aux_entries = {{kSelfVerifyFunc}};
    } else {
      ABSL_DCHECK(!message_options.is_lite);
      // The message set parser loop only handles codegen because it hardcodes
      // the generated extension registry. For reflection, use the reflection
      // loop which can handle arbitrary message factories.
      fast_path_fields = {{TailCallTableInfo::FastFieldInfo::NonField{
          TcParseFunction::kReflectionParseLoop, 0, 0}}};
    }

    table_size_log2 = 0;
    num_to_entry_table = MakeNumToEntryTable(ordered_fields);
    field_name_data = GenerateFieldNames(descriptor, field_entries,
                                         message_options, ordered_fields);

    return;
  }

  ABSL_DCHECK(std::is_sorted(ordered_fields.begin(), ordered_fields.end(),
                             [](const auto& lhs, const auto& rhs) {
                               return lhs.field->number() < rhs.field->number();
                             }));
  // If this message has any inlined string fields, store the donation state
  // offset in the first auxiliary entry, which is kInlinedStringAuxIdx.
  if (std::any_of(ordered_fields.begin(), ordered_fields.end(),
                  [](auto& f) { return f.is_string_inlined; })) {
    aux_entries.resize(kInlinedStringAuxIdx + 1);  // Allocate our slot
    aux_entries[kInlinedStringAuxIdx] = {kInlinedStringDonatedOffset};
  }

  // If this message is split, store the split pointer offset in the second
  // and third auxiliary entries, which are kSplitOffsetAuxIdx and
  // kSplitSizeAuxIdx.
  if (std::any_of(ordered_fields.begin(), ordered_fields.end(),
                  [](auto& f) { return f.should_split; })) {
    static_assert(kSplitOffsetAuxIdx + 1 == kSplitSizeAuxIdx, "");
    aux_entries.resize(kSplitSizeAuxIdx + 1);  // Allocate our 2 slots
    aux_entries[kSplitOffsetAuxIdx] = {kSplitOffset};
    aux_entries[kSplitSizeAuxIdx] = {kSplitSizeof};
  }

  field_entries = BuildFieldEntries(descriptor, message_options, ordered_fields,
                                    aux_entries);

  auto end_group_tag = GetEndGroupTag(descriptor);

  FastFieldInfo fast_fields[TcParseTableBase::kMaxFastFields];
  // Bit mask for the fields that are "important". Unimportant fields might be
  // set but it's ok if we lose them from the fast table. For example, cold
  // fields.
  uint32_t important_fields = 0;
  static_assert(
      sizeof(important_fields) * 8 >= TcParseTableBase::kMaxFastFields, "");
  // The largest table we allow has the same number of entries as the
  // message has fields, rounded up to the next power of 2 (e.g., a message
  // with 5 fields can have a fast table of size 8). A larger table *might*
  // cover more fields in certain cases, but a larger table in that case
  // would have mostly empty entries; so, we cap the size to avoid
  // pathologically sparse tables.
  // However, if this message uses group encoding, the tables are sometimes very
  // sparse because the fields in the group avoid using the same field
  // numbering as the parent message (even though currently, the proto
  // compiler allows the overlap, and there is no possible conflict.)
  // NOTE: The +1 is to maintain the existing behavior that does not match the
  // documented one. When the number of fields is exactly a power of two we
  // allow double that.
  size_t num_fast_fields =
      FastParseTableSize(ordered_fields.size(), end_group_tag);
  PopulateFastFields(
      end_group_tag, field_entries, message_options, ordered_fields,
      absl::MakeSpan(fast_fields, num_fast_fields), important_fields);
  // If we can halve the table without dropping important fields, do it.
  while (num_fast_fields > 1 &&
         (important_fields & (important_fields >> num_fast_fields / 2)) == 0) {
    // Half the table by merging fields.
    num_fast_fields /= 2;
    for (size_t i = 0; i < num_fast_fields; ++i) {
      size_t merge_i = i + num_fast_fields;
      // Overwrite the surviving entries if the discarded half contains an
      // important field (meaning the surviving entry is not) or the surviving
      // entry is empty.
      if (((important_fields >> merge_i) & 1) != 0 ||
          fast_fields[i].is_empty()) {
        fast_fields[i] = fast_fields[merge_i];
      }
    }
    important_fields |= important_fields >> num_fast_fields;
  }

  fast_path_fields.assign(fast_fields, fast_fields + num_fast_fields);
  table_size_log2 = absl::bit_width(num_fast_fields) - 1;

  num_to_entry_table = MakeNumToEntryTable(ordered_fields);
  ABSL_CHECK_EQ(field_entries.size(), ordered_fields.size());
  field_name_data = GenerateFieldNames(descriptor, field_entries,
                                       message_options, ordered_fields);
}